

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O0

void __thiscall
SharedMemoryObject<pthread_cond_t>::SharedMemoryObject<>(SharedMemoryObject<pthread_cond_t> *this)

{
  anon_union_48_3_8654423c *paVar1;
  ContextManager *pCVar2;
  string local_30;
  SharedMemoryObject<pthread_cond_t> *local_10;
  SharedMemoryObject<pthread_cond_t> *this_local;
  
  local_10 = this;
  paVar1 = (anon_union_48_3_8654423c *)allocate_shared_memory(0x30);
  this->ptr_ = paVar1;
  paVar1 = this->ptr_;
  memset(paVar1,0,0x30);
  this->ptr_ = paVar1;
  if (this->ptr_ == (anon_union_48_3_8654423c *)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot allocate %zu bytes of shared memory: %m",0x30);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

explicit SharedMemoryObject(Args &&... args) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T)));
        ptr_ = new(ptr_) T(args...);
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }